

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uart_ping_pong.c
# Opt level: O1

void client_handle_write(cio_buffered_stream *buffered_stream,void *handler_context,cio_error err)

{
  cio_error cVar1;
  
  if (err == CIO_SUCCESS) {
    fwrite("Client wrote data, now receiving...\n",0x24,1,_stdout);
    *(long *)((long)handler_context + 0x100) =
         *(long *)((long)handler_context + 0x100) + *handler_context;
    cVar1 = cio_buffered_stream_read_at_least
                      (buffered_stream,(cio_read_buffer *)((long)handler_context + 0xe8),6,
                       client_handle_read,handler_context);
    if (cVar1 != CIO_SUCCESS) {
      client_handle_write_cold_2();
    }
  }
  else {
    client_handle_write_cold_1();
  }
  return;
}

Assistant:

static void client_handle_write(struct cio_buffered_stream *buffered_stream, void *handler_context, enum cio_error err)
{
	struct client *client = handler_context;

	if (cio_unlikely(err != CIO_SUCCESS)) {
		(void)fprintf(stderr, "client failed to write!\n");
		return;
	}

	(void)fprintf(stdout, "Client wrote data, now receiving...\n");

	cio_read_buffer_consume(&client->rb, client->bytes_read);

	err = cio_buffered_stream_read_at_least(buffered_stream, &client->rb, sizeof(HELLO), client_handle_read, client);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		(void)fprintf(stderr, "server could no start reading!\n");
		return;
	}
}